

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

ParamIteratorInterface<bool> * __thiscall
testing::internal::ValuesInIteratorRangeGenerator<bool>::Iterator::Clone(Iterator *this)

{
  _func_int **pp_Var1;
  ParamIteratorInterface<bool> *pPVar2;
  
  pPVar2 = (ParamIteratorInterface<bool> *)operator_new(0x28);
  pPVar2->_vptr_ParamIteratorInterface = (_func_int **)&PTR__Iterator_0058fc70;
  pPVar2[1]._vptr_ParamIteratorInterface = (_func_int **)this->base_;
  pp_Var1 = *(_func_int ***)&(this->iterator_).super__Bit_iterator_base._M_offset;
  pPVar2[2]._vptr_ParamIteratorInterface =
       (_func_int **)(this->iterator_).super__Bit_iterator_base._M_p;
  pPVar2[3]._vptr_ParamIteratorInterface = pp_Var1;
  pPVar2[4]._vptr_ParamIteratorInterface = (_func_int **)0x0;
  return pPVar2;
}

Assistant:

ParamIteratorInterface<T>* Clone() const override {
      return new Iterator(*this);
    }